

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

bool DecompressScript(CScript *script,uint nSize,CompressedScript *in)

{
  Span<const_unsigned_char> _vch;
  bool bVar1;
  uint uVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  value_type_conflict *pvVar3;
  uchar *puVar4;
  uchar *__src;
  uint in_ESI;
  long in_FS_OFFSET;
  CPubKey pubkey;
  uchar vch [33];
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined8 in_stack_ffffffffffffff20;
  size_type pos;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  uchar uVar5;
  uchar *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  size_type new_size;
  bool local_91;
  char local_38;
  undefined8 local_37;
  undefined8 local_2f;
  undefined8 local_27;
  undefined8 local_1f;
  long local_8;
  
  pos = (size_type)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  new_size = (size_type)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(ulong)in_ESI;
  uVar5 = (uchar)in_ESI;
  switch(this) {
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(this,new_size);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 'v';
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0xa9;
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = '\x14';
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    pvVar3 = prevector<33U,_unsigned_char,_unsigned_int,_int>::data
                       ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    *(undefined8 *)puVar4 = *(undefined8 *)pvVar3;
    *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(pvVar3 + 8);
    *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)(pvVar3 + 0x10);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0x88;
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0xac;
    local_91 = true;
    break;
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x1:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(this,new_size);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0xa9;
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = '\x14';
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    pvVar3 = prevector<33U,_unsigned_char,_unsigned_int,_int>::data
                       ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    *(undefined8 *)puVar4 = *(undefined8 *)pvVar3;
    *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(pvVar3 + 8);
    *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)(pvVar3 + 0x10);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0x87;
    local_91 = true;
    break;
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x2:
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x3:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(this,new_size);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
    *puVar4 = '!';
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(uVar5,in_stack_ffffffffffffff28),pos);
    *puVar4 = uVar5;
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(uVar5,in_stack_ffffffffffffff28),pos);
    pvVar3 = prevector<33U,_unsigned_char,_unsigned_int,_int>::data
                       ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    *(undefined8 *)puVar4 = *(undefined8 *)pvVar3;
    *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(pvVar3 + 8);
    *(undefined8 *)(puVar4 + 0x10) = *(undefined8 *)(pvVar3 + 0x10);
    *(undefined8 *)(puVar4 + 0x18) = *(undefined8 *)(pvVar3 + 0x18);
    puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(uVar5,in_stack_ffffffffffffff28),pos);
    *puVar4 = 0xac;
    local_91 = true;
    break;
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x4:
  case (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x5:
    memset(&local_38,0,0x21);
    local_38 = uVar5 + 0xfe;
    pvVar3 = prevector<33U,_unsigned_char,_unsigned_int,_int>::data
                       ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_37 = *(undefined8 *)pvVar3;
    local_2f = *(undefined8 *)(pvVar3 + 8);
    local_27 = *(undefined8 *)(pvVar3 + 0x10);
    local_1f = *(undefined8 *)(pvVar3 + 0x18);
    Span<const_unsigned_char>::Span<33>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               (uchar (*) [33])0xdb0dbb);
    _vch.m_size = in_stack_ffffffffffffff38;
    _vch.m_data = in_stack_ffffffffffffff30;
    CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),_vch);
    bVar1 = CPubKey::Decompress((CPubKey *)
                                CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (bVar1) {
      uVar2 = CPubKey::size((CPubKey *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18)
                           );
      if (uVar2 != 0x41) {
        __assert_fail("pubkey.size() == 65",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/compressor.cpp"
                      ,0x82,
                      "bool DecompressScript(CScript &, unsigned int, const CompressedScript &)");
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(this,new_size);
      puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
      *puVar4 = 'A';
      puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),pos);
      __src = CPubKey::begin((CPubKey *)
                             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      memcpy(puVar4,__src,0x41);
      puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                          (size_type)((ulong)puVar4 >> 0x20));
      *puVar4 = 0xac;
      local_91 = true;
    }
    else {
      local_91 = false;
    }
    break;
  default:
    local_91 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool DecompressScript(CScript& script, unsigned int nSize, const CompressedScript& in)
{
    switch(nSize) {
    case 0x00:
        script.resize(25);
        script[0] = OP_DUP;
        script[1] = OP_HASH160;
        script[2] = 20;
        memcpy(&script[3], in.data(), 20);
        script[23] = OP_EQUALVERIFY;
        script[24] = OP_CHECKSIG;
        return true;
    case 0x01:
        script.resize(23);
        script[0] = OP_HASH160;
        script[1] = 20;
        memcpy(&script[2], in.data(), 20);
        script[22] = OP_EQUAL;
        return true;
    case 0x02:
    case 0x03:
        script.resize(35);
        script[0] = 33;
        script[1] = nSize;
        memcpy(&script[2], in.data(), 32);
        script[34] = OP_CHECKSIG;
        return true;
    case 0x04:
    case 0x05:
        unsigned char vch[33] = {};
        vch[0] = nSize - 2;
        memcpy(&vch[1], in.data(), 32);
        CPubKey pubkey{vch};
        if (!pubkey.Decompress())
            return false;
        assert(pubkey.size() == 65);
        script.resize(67);
        script[0] = 65;
        memcpy(&script[1], pubkey.begin(), 65);
        script[66] = OP_CHECKSIG;
        return true;
    }
    return false;
}